

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O3

void __thiscall libebml::EbmlMaster::~EbmlMaster(EbmlMaster *this)

{
  pointer ppEVar1;
  pointer ppEVar2;
  ulong uVar3;
  
  (this->super_EbmlElement)._vptr_EbmlElement = (_func_int **)&PTR__EbmlMaster_001cd6e8;
  if ((this->super_EbmlElement).bLocked == false) {
    ppEVar1 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar2 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar2 != ppEVar1) {
      uVar3 = 0;
      do {
        if (ppEVar1[uVar3]->bLocked == false) {
          (*ppEVar1[uVar3]->_vptr_EbmlElement[1])();
          ppEVar1 = (this->ElementList).
                    super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppEVar2 = (this->ElementList).
                    super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)ppEVar2 - (long)ppEVar1 >> 3));
    }
    EbmlBinary::~EbmlBinary(&(this->Checksum).super_EbmlBinary);
    ppEVar1 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar1 != (pointer)0x0) {
      operator_delete(ppEVar1,(long)(this->ElementList).
                                    super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppEVar1);
    }
    EbmlElement::~EbmlElement(&this->super_EbmlElement);
    return;
  }
  __assert_fail("!IsLocked()",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlMaster.cpp"
                ,0x4b,"virtual libebml::EbmlMaster::~EbmlMaster()");
}

Assistant:

EbmlMaster::~EbmlMaster()
{
  assert(!IsLocked()); // you're trying to delete a locked element !!!

  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if (!(*ElementList[Index]).IsLocked())  {
      delete ElementList[Index];
    }
  }
}